

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

ssize_t writen(int fd,void *buff,size_t n)

{
  ssize_t sVar1;
  int *piVar2;
  void *local_48;
  char *ptr;
  ssize_t writeSum;
  ssize_t nwritten;
  size_t nleft;
  size_t n_local;
  void *buff_local;
  char *pcStack_10;
  int fd_local;
  
  ptr = (char *)0x0;
  local_48 = buff;
  nwritten = n;
  do {
    while( true ) {
      if (nwritten == 0) {
        return (ssize_t)ptr;
      }
      sVar1 = write(fd,local_48,nwritten);
      if ((sVar1 < 1) && (sVar1 < 0)) break;
      ptr = ptr + sVar1;
      nwritten = nwritten - sVar1;
      local_48 = (void *)(sVar1 + (long)local_48);
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  piVar2 = __errno_location();
  if (*piVar2 == 0xb) {
    pcStack_10 = ptr;
  }
  else {
    pcStack_10 = (char *)0xffffffffffffffff;
  }
  return (ssize_t)pcStack_10;
}

Assistant:

ssize_t writen(int fd, void *buff, size_t n) {
  size_t nleft = n;
  ssize_t nwritten = 0;
  ssize_t writeSum = 0;
  char *ptr = (char *)buff;
  while (nleft > 0) {
    if ((nwritten = write(fd, ptr, nleft)) <= 0) {
      if (nwritten < 0) {
        if (errno == EINTR) {
          nwritten = 0;
          continue;
        } else if (errno == EAGAIN) {
          return writeSum;
        } else
          return -1;
      }
    }
    writeSum += nwritten;
    nleft -= nwritten;
    ptr += nwritten;
  }
  return writeSum;
}